

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

void ui_mouse(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  ImVec2 IVar4;
  ImGuiIO *pIVar5;
  int local_18;
  int iStack_14;
  
  bVar3 = (byte)(a_app_state->pointer).buttons;
  uVar1 = (a_app_state->pointer).x;
  uVar2 = (a_app_state->pointer).y;
  pIVar5 = ImGui::GetIO();
  IVar4.y = (float)(int)uVar2;
  IVar4.x = (float)(int)uVar1;
  pIVar5->MousePos = IVar4;
  pIVar5->MouseDown[0] = (bool)(bVar3 & 1);
  pIVar5->MouseDown[1] = (bool)(bVar3 >> 1 & 1);
  pIVar5->MouseDown[2] = (bool)(bVar3 >> 2 & 1);
  return;
}

Assistant:

void ui_mouse() {
	const unsigned int btn = a_app_state->pointer.buttons;
	const int x = a_app_state->pointer.x;
	const int y = a_app_state->pointer.y;
	ImGuiIO& io = ImGui::GetIO();
	io.MousePos = ImVec2((float)x, (float)y);
	io.MouseDown[0] = !!(btn & AB_Left);
	io.MouseDown[1] = !!(btn & AB_Right);
	io.MouseDown[2] = !!(btn & AB_Middle);
}